

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O0

void __thiscall
snestistics::AnnotationResolver::load(AnnotationResolver *this,istream *input,string *error_file)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1988 [39];
  undefined1 local_1961;
  undefined1 local_1960 [7];
  bool convert_single_byte_functions_to_labels;
  Annotation a;
  Hint ta;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18c0 [32];
  char *local_18a0;
  char *stripped;
  char buf [4096];
  uint local_87c;
  int line_number;
  istream *f;
  int size;
  Pointer start;
  char mycomment [1024];
  char name [1024];
  string local_60 [7];
  bool comment_is_multiline;
  string useComment;
  string local_40 [8];
  string comment;
  string *error_file_local;
  istream *input_local;
  AnnotationResolver *this_local;
  
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  name[0x3ff] = '\0';
  memset(mycomment + 0x3f8,0,0x400);
  local_87c = 0;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          do {
            bVar1 = std::ios::eof();
            if (((bVar1 ^ 0xff) & 1) == 0) {
              std::__cxx11::string::~string(local_60);
              std::__cxx11::string::~string(local_40);
              return;
            }
            local_87c = local_87c + 1;
            std::istream::getline((char *)input,(long)&stripped);
            f._0_4_ = 0;
            sVar3 = strlen((char *)&stripped);
          } while ((sVar3 == 0) || ((char)stripped == '@'));
          if ((char)stripped != ';') break;
          local_18a0 = (char *)((long)&stripped + 2);
          if (stripped._1_1_ == '\0') {
            local_18a0 = "";
          }
          else if (stripped._1_1_ != ' ') {
            local_18a0 = (char *)((long)&stripped + 1);
          }
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ta,
                           (char *)local_40);
            std::operator+(local_18c0,(char *)&ta);
            std::__cxx11::string::operator=(local_40,(string *)local_18c0);
            std::__cxx11::string::~string((string *)local_18c0);
            std::__cxx11::string::~string((string *)&ta);
            name[0x3ff] = '\x01';
          }
          else {
            std::__cxx11::string::operator=(local_40,local_18a0);
          }
        }
        if ((char)stripped != '#') break;
        std::__cxx11::string::operator=(local_60,(char *)((long)&stripped + 2));
      }
      iVar2 = __isoc99_sscanf(&stripped,"hint %06X %s",(long)&f + 4,mycomment + 0x3f8);
      if (iVar2 < 1) break;
      iVar2 = strcmp(mycomment + 0x3f8,"jump_is_jsr");
      if (iVar2 == 0) {
        a.startOfRange._0_1_ = 1;
      }
      else {
        iVar2 = strcmp(mycomment + 0x3f8,"jump_is_jsr_ish");
        if (iVar2 == 0) {
          a.startOfRange._0_1_ = 2;
        }
        else {
          iVar2 = strcmp(mycomment + 0x3f8,"jsr_is_jmp");
          if (iVar2 == 0) {
            a.startOfRange._0_1_ = 4;
          }
          else {
            iVar2 = strcmp(mycomment + 0x3f8,"branch_always");
            if (iVar2 == 0) {
              a.startOfRange._0_1_ = 8;
            }
            else {
              iVar2 = strcmp(mycomment + 0x3f8,"branch_never");
              if (iVar2 == 0) {
                a.startOfRange._0_1_ = 0x10;
              }
              else {
                iVar2 = strcmp(mycomment + 0x3f8,"annotate_merge");
                if (iVar2 == 0) {
                  a.startOfRange._0_1_ = 0x20;
                }
                else {
                  printf("Unknown hint \'%s\'\n",mycomment + 0x3f8);
                }
              }
            }
          }
        }
      }
      a.endOfRange = f._4_4_;
      std::vector<snestistics::Hint,_std::allocator<snestistics::Hint>_>::push_back
                (&this->_hints,(value_type *)&a.startOfRange);
    }
    Annotation::Annotation((Annotation *)local_1960);
    iVar2 = __isoc99_sscanf(&stripped,"function %06X %06X %s",&a.field_0x68,&a.field_0x6c,
                            mycomment + 0x3f8);
    if (iVar2 < 1) {
      iVar2 = __isoc99_sscanf(&stripped,"line %06X",&a.field_0x68);
      if (iVar2 < 1) {
        iVar2 = __isoc99_sscanf(&stripped,"comment %06X \"%[^\"]",&a.field_0x68,&size);
        if (iVar2 < 1) {
          iVar2 = __isoc99_sscanf(&stripped,"label %06X %s",&a.field_0x68,mycomment + 0x3f8);
          if (iVar2 < 1) {
            iVar2 = __isoc99_sscanf(&stripped,"data %06X %06X %s",&a.field_0x68,&a.field_0x6c,
                                    mycomment + 0x3f8);
            if (iVar2 < 1) {
              uVar5 = std::__cxx11::string::c_str();
              printf("%s:%d: Not supported format!\n\t\'%s\'\n",uVar5,(ulong)local_87c,&stripped);
              exit(99);
            }
            local_1960._0_4_ = ANNOTATION_DATA;
          }
          else {
            local_1960._0_4_ = ANNOTATION_LINE;
            a._108_4_ = a._104_4_;
          }
        }
        else {
          local_1960._0_4_ = ANNOTATION_LINE;
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            std::operator+(local_19a8,(char *)local_40);
            std::operator+(local_1988,(char *)local_19a8);
            std::__cxx11::string::operator=(local_40,(string *)local_1988);
            std::__cxx11::string::~string((string *)local_1988);
            std::__cxx11::string::~string((string *)local_19a8);
            name[0x3ff] = '\x01';
          }
          else {
            std::__cxx11::string::operator=(local_40,(char *)&size);
          }
          std::__cxx11::string::operator=(local_60,"");
          a._108_4_ = a._104_4_;
        }
      }
      else {
        local_1960._0_4_ = ANNOTATION_LINE;
        a._108_4_ = a._104_4_;
      }
    }
    else {
      local_1960._0_4_ = ANNOTATION_FUNCTION;
      local_1961 = 0;
    }
    std::__cxx11::string::operator=((string *)&a.comment_is_multiline,local_60);
    std::__cxx11::string::operator=((string *)&a.field_0x20,local_40);
    a._64_1_ = name[0x3ff];
    std::__cxx11::string::operator=((string *)&a,mycomment + 0x3f8);
    std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>::push_back
              (&this->_annotations,(value_type *)local_1960);
    std::__cxx11::string::clear();
    std::__cxx11::string::clear();
    name[0x3ff] = '\0';
    mycomment[0x3f8] = '\0';
    Annotation::~Annotation((Annotation *)local_1960);
  } while( true );
}

Assistant:

void AnnotationResolver::load(std::istream &input, const std::string &error_file) {
	std::string comment;
	std::string useComment;
	bool comment_is_multiline = false;

	char name[1024]="";
	char mycomment[1024];

	Pointer start;

	int size;

	std::istream &f = input;

	int line_number = 0;
	
	while (!f.eof()) {
		line_number++;
		char buf[4096];
		f.getline(buf, 4096);

		size = 0;

		if (strlen(buf) == 0) {
			continue;
		}
		if (buf[0] == '@') {
			// meta-comment
			continue;
		} else if (buf[0] == ';') {
			const char *stripped = &buf[2];
			if (buf[1]=='\0') {
				stripped = "";
			} else if (buf[1] != ' ') {
				stripped = &buf[1];
			}
			if (!comment.empty()) {
				comment = comment + "\n" + stripped;
				comment_is_multiline = true;
			}
			else {
				comment = stripped;
			}
		}
		else if (buf[0] == '#') {
			useComment = &buf[2];
		} else if (sscanf(buf, "hint %06X %s", &start, (char*)&name) > 0) {

			Hint ta;
			if (strcmp(name, "jump_is_jsr")==0) {
				ta.hints = Hint::JUMP_IS_JSR;
			} else if (strcmp(name, "jump_is_jsr_ish")==0) {
				ta.hints = Hint::JUMP_IS_JSR_ISH;
			} else if (strcmp(name, "jsr_is_jmp")==0) {
				ta.hints = Hint::JSR_IS_JMP;
			} else if (strcmp(name, "branch_always") == 0) {
				ta.hints = Hint::BRANCH_ALWAYS;
			} else if (strcmp(name, "branch_never") == 0) {
				ta.hints = Hint::BRANCH_NEVER;
			} else if (strcmp(name, "annotate_merge") == 0) {
				ta.hints = Hint::ANNOTATE_MERGE;
			} else {
				printf("Unknown hint '%s'\n", name);
			}
			ta.location = start;
			_hints.push_back(ta);
			continue;
		} else {

			Annotation a;

			if (sscanf(buf, "function %06X %06X %s", &a.startOfRange, &a.endOfRange, name) > 0) {
				a.type = ANNOTATION_FUNCTION;
				const bool convert_single_byte_functions_to_labels = false;
				if (convert_single_byte_functions_to_labels && a.startOfRange == a.endOfRange) {
					a.type = ANNOTATION_LINE;
					printf("Function '%s' is only one byte long, treating as 'label' instead!\n", name);
					a.endOfRange = a.startOfRange;
				}
			} else if (sscanf(buf, "line %06X", &a.startOfRange) > 0) { // TODO: Does this makes sense?
				a.type = ANNOTATION_LINE;
				a.endOfRange = a.startOfRange;
			} else if (sscanf(buf, "comment %06X \"%[^\"]", &a.startOfRange, mycomment) > 0) {
				a.type = ANNOTATION_LINE;
				if (comment.empty()) {
					comment = mycomment;
				} else {
					comment = comment + "\n" + mycomment;
					comment_is_multiline = true;
				}
				useComment = "";
				a.endOfRange = a.startOfRange;
			} else if (sscanf(buf, "label %06X %s", &a.startOfRange, name) > 0) {
				a.type = ANNOTATION_LINE;
				a.endOfRange = a.startOfRange;
			} else if (sscanf(buf, "data %06X %06X %s", &a.startOfRange, &a.endOfRange, name) >0 ) {
				a.type = ANNOTATION_DATA;
			} else {
				printf("%s:%d: Not supported format!\n\t'%s'\n", error_file.c_str(), line_number, buf);
				exit(99);
			}


			a.useComment = useComment;
			a.comment = comment;
			a.comment_is_multiline = comment_is_multiline;
			a.name = name;
			_annotations.push_back(a);

			// Reset state
			comment.clear();
			useComment.clear();
			comment_is_multiline = false;
			name[0]='\0';
		}
	}
}